

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int decodeInstruction(InternalInstruction *insn,byteReader_t reader,void *readerArg,
                     uint64_t startLoc,DisassemblerMode mode)

{
  DisassemblerMode DVar1;
  VectorExtensionType VVar2;
  uint64_t uVar3;
  short sVar4;
  uint8_t uVar5;
  int iVar6;
  int iVar7;
  uint64_t uVar8;
  ulong uVar9;
  byte bVar10;
  uint8_t uVar11;
  ushort uVar12;
  short sVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint64_t uVar18;
  ulong uVar19;
  ushort uVar20;
  uint16_t attrMask;
  byte bVar21;
  uint8_t uVar22;
  uint8_t *puVar23;
  reader_info *prVar24;
  bool bVar25;
  uint8_t byte;
  uint16_t instructionID;
  uint8_t byte1_3;
  uint8_t nextByte;
  uint8_t byte1;
  uint8_t byte1_1;
  uint8_t byte1_2;
  uint8_t byte2;
  uint16_t instructionIDWithOpsize;
  byte local_54;
  byte local_53;
  ushort local_52;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  undefined8 local_48;
  undefined8 local_40;
  ushort local_34;
  ushort local_32;
  ushort uVar13;
  
  insn->reader = reader;
  insn->readerArg = readerArg;
  insn->startLocation = startLoc;
  insn->readerCursor = startLoc;
  insn->mode = mode;
  local_54 = 0;
  local_48 = 0;
  local_40 = 0;
  do {
    if (mode == MODE_64BIT) {
      iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_54,insn->readerCursor);
      if (iVar6 != 0) {
        return -1;
      }
      uVar8 = insn->readerCursor;
      uVar18 = uVar8 + 1;
      insn->readerCursor = uVar18;
      if ((local_54 & 0xf0) == 0x40) {
        prVar24 = (reader_info *)insn->readerArg;
        while( true ) {
          iVar6 = (*insn->reader)(prVar24,&local_54,uVar18);
          if (iVar6 != 0) {
            return -1;
          }
          if ((local_54 & 0xf0) != 0x40) break;
          iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_54,insn->readerCursor);
          if (iVar6 != 0) {
            return -1;
          }
          prVar24 = (reader_info *)insn->readerArg;
          uVar18 = insn->readerCursor + 1;
          insn->readerCursor = uVar18;
        }
        if ((((local_54 - 0x2e < 0x3a) &&
             ((0x3c0000000010101U >> ((ulong)(local_54 - 0x2e) & 0x3f) & 1) != 0)) ||
            ((local_54 - 0xf0 < 4 && (local_54 - 0xf0 != 1)))) || (local_54 == 0x26))
        goto LAB_0019e851;
        uVar8 = insn->readerCursor - 1;
      }
      insn->readerCursor = uVar8;
    }
LAB_0019e851:
    uVar18 = insn->readerCursor;
    iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_54,uVar18);
    if (iVar6 != 0) {
      return -1;
    }
    uVar3 = insn->readerCursor;
    uVar8 = uVar3 + 1;
    insn->readerCursor = uVar8;
    if ((local_54 & 0xfe) == 0xf2 && uVar3 == insn->startLocation) {
      iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,uVar8);
      if (iVar6 != 0) {
        return -1;
      }
      if ((local_54 & 0xfe) == 0xf2) {
        if (((local_4d == 0xf0) || ((local_4d & 0xfe) == 0x86)) || ((local_4d & 0xfffffff8) == 0x90)
           ) {
          insn->xAcquireRelease = true;
        }
        if (((local_54 == 0xf3) && (uVar15 = local_4d - 0x88, uVar15 < 0x40)) &&
           ((0xc000000000000003U >> ((ulong)uVar15 & 0x3f) & 1) != 0)) {
          insn->xAcquireRelease = true;
        }
      }
      if ((insn->mode == MODE_64BIT) && ((local_4d & 0xf0) == 0x40)) {
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,insn->readerCursor);
        if (iVar6 != 0) {
          return -1;
        }
        uVar8 = insn->readerCursor + 1;
        insn->readerCursor = uVar8;
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,uVar8);
        if (iVar6 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor - 1;
      }
    }
    if (local_54 < 0x3e) {
      if (local_54 == 0x26) {
        insn->segmentOverride = SEG_OVERRIDE_ES;
        insn->isPrefix65 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix64 = false;
        insn->isPrefix26 = true;
        insn->prefix26 = uVar18;
        insn->prefix1 = '&';
      }
      else if (local_54 == 0x2e) {
        insn->segmentOverride = SEG_OVERRIDE_CS;
        insn->isPrefix64 = false;
        insn->isPrefix65 = false;
        insn->isPrefix26 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix2e = true;
        insn->prefix2e = uVar18;
        insn->prefix1 = '.';
      }
      else {
        if (local_54 != 0x36) break;
        insn->segmentOverride = SEG_OVERRIDE_SS;
        insn->isPrefix64 = false;
        insn->isPrefix65 = false;
        insn->isPrefix26 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix36 = true;
        insn->prefix36 = uVar18;
        insn->prefix1 = '6';
      }
    }
    else {
      if (local_54 - 100 < 4) {
        iVar6 = (*(code *)(&DAT_001eb220 + *(int *)(&DAT_001eb220 + (ulong)(local_54 - 100) * 4)))()
        ;
        return iVar6;
      }
      if ((local_54 - 0xf0 < 4) && (local_54 - 0xf0 != 1)) {
        insn->isPrefixf3 = false;
        insn->isPrefixf0 = false;
        insn->isPrefixf2 = false;
        if (local_54 == 0xf3) {
          insn->isPrefixf3 = true;
          lVar17 = 0x60;
LAB_0019eb40:
          *(uint64_t *)(&insn->operandSize + lVar17) = uVar18;
        }
        else {
          if (local_54 == 0xf2) {
            insn->isPrefixf2 = true;
            lVar17 = 0x58;
            goto LAB_0019eb40;
          }
          if (local_54 == 0xf0) {
            insn->isPrefixf0 = true;
            lVar17 = 0x50;
            goto LAB_0019eb40;
          }
        }
        insn->prefix0 = local_54;
      }
      else {
        if (local_54 != 0x3e) break;
        insn->segmentOverride = SEG_OVERRIDE_DS;
        insn->isPrefix64 = false;
        insn->isPrefix65 = false;
        insn->isPrefix26 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix3e = true;
        insn->prefix3e = uVar18;
        insn->prefix1 = '>';
      }
    }
    mode = insn->mode;
  } while( true );
  insn->vectorExtensionType = TYPE_NO_VEX_XOP;
  if (local_54 < 0xc4) {
    if (local_54 == 0x62) {
      iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4e,insn->readerCursor);
      if (iVar6 != 0) {
        return -1;
      }
      uVar18 = insn->readerCursor;
      uVar8 = uVar18 + 1;
      insn->readerCursor = uVar8;
      if ((local_4e & 0xc) == 0 && (0xbf < local_4e || insn->mode == MODE_64BIT)) {
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_49,uVar8);
        if (iVar6 != 0) {
          return -1;
        }
        if ((local_49 & 4) == 0) {
          uVar8 = insn->readerCursor;
          uVar18 = uVar8 - 2;
          insn->readerCursor = uVar18;
          insn->necessaryPrefixLocation = uVar8 - 4;
          if (insn->vectorExtensionType != TYPE_EVEX) goto LAB_0019ee08;
        }
        else {
          insn->vectorExtensionType = TYPE_EVEX;
          uVar18 = insn->readerCursor;
        }
        insn->vectorExtensionPrefix[0] = local_54;
        insn->vectorExtensionPrefix[1] = local_4e;
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,
                                uVar18);
        if (iVar6 != 0) {
          return -1;
        }
        prVar24 = (reader_info *)insn->readerArg;
        uVar18 = insn->readerCursor + 1;
        insn->readerCursor = uVar18;
        puVar23 = insn->vectorExtensionPrefix + 3;
        goto LAB_0019f12f;
      }
      uVar18 = uVar18 - 1;
      insn->readerCursor = uVar18;
      goto LAB_0019ee08;
    }
    if (local_54 != 0x8f) goto LAB_0019ec37;
    iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4c,insn->readerCursor);
    if (iVar6 != 0) {
      return -1;
    }
    if ((local_4c & 0x38) == 0) {
      uVar8 = insn->readerCursor;
      uVar18 = uVar8 - 1;
      insn->readerCursor = uVar18;
      insn->necessaryPrefixLocation = uVar8 - 2;
      if (insn->vectorExtensionType != TYPE_XOP) goto LAB_0019ee08;
    }
    else {
      insn->vectorExtensionType = TYPE_XOP;
      uVar18 = insn->readerCursor;
      insn->necessaryPrefixLocation = uVar18 - 1;
    }
    insn->vectorExtensionPrefix[0] = local_54;
    iVar6 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,uVar18);
    if (iVar6 != 0) {
      return -1;
    }
    uVar18 = insn->readerCursor + 1;
    insn->readerCursor = uVar18;
    iVar6 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,uVar18);
    if (iVar6 != 0) {
      return -1;
    }
    uVar18 = insn->readerCursor + 1;
    insn->readerCursor = uVar18;
    bVar10 = insn->vectorExtensionPrefix[2];
    if (insn->mode == MODE_64BIT) {
      insn->rexPrefix = (byte)~insn->vectorExtensionPrefix[1] >> 5 | bVar10 >> 4 & 8 | 0x40;
    }
LAB_0019f267:
    bVar21 = 1;
    if ((bVar10 & 3) != 1) {
      bVar21 = (byte)local_48;
    }
  }
  else {
    if (local_54 != 0xc4) {
      if (local_54 == 0xc5) {
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4b,insn->readerCursor);
        if (iVar6 != 0) {
          return -1;
        }
        if ((insn->mode == MODE_64BIT) || (0xbf < local_4b)) {
          insn->vectorExtensionType = TYPE_VEX_2B;
          uVar18 = insn->readerCursor;
        }
        else {
          uVar18 = insn->readerCursor - 1;
          insn->readerCursor = uVar18;
          if (insn->vectorExtensionType != TYPE_VEX_2B) goto LAB_0019ee08;
        }
        insn->vectorExtensionPrefix[0] = local_54;
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,
                                uVar18);
        if (iVar6 != 0) {
          return -1;
        }
        uVar18 = insn->readerCursor + 1;
        insn->readerCursor = uVar18;
        bVar10 = insn->vectorExtensionPrefix[1];
        if (insn->mode == MODE_64BIT) {
          insn->rexPrefix = (byte)~bVar10 >> 5 & 4 | 0x40;
        }
        goto LAB_0019f267;
      }
LAB_0019ec37:
      if ((insn->mode == MODE_64BIT) && ((local_54 & 0xf0) == 0x40)) {
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4f,insn->readerCursor);
        if (iVar6 != 0) {
          return -1;
        }
        while ((local_4f & 0xf0) == 0x40) {
          iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_54,insn->readerCursor);
          if (iVar6 != 0) {
            return -1;
          }
          uVar18 = insn->readerCursor + 1;
          insn->readerCursor = uVar18;
          iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4f,uVar18);
          if (iVar6 != 0) {
            return -1;
          }
        }
        insn->rexPrefix = local_54;
        uVar18 = insn->readerCursor;
        uVar8 = uVar18;
      }
      else {
        uVar8 = insn->readerCursor;
        uVar18 = uVar8 - 1;
        insn->readerCursor = uVar18;
      }
      insn->necessaryPrefixLocation = uVar8 - 2;
      goto LAB_0019ee08;
    }
    iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_4a,insn->readerCursor);
    if (iVar6 != 0) {
      return -1;
    }
    if ((insn->mode == MODE_64BIT) || (0xbf < local_4a)) {
      insn->vectorExtensionType = TYPE_VEX_3B;
      uVar18 = insn->readerCursor;
      insn->necessaryPrefixLocation = uVar18 - 1;
    }
    else {
      uVar8 = insn->readerCursor;
      uVar18 = uVar8 - 1;
      insn->readerCursor = uVar18;
      insn->necessaryPrefixLocation = uVar8 - 2;
      if (insn->vectorExtensionType != TYPE_VEX_3B) goto LAB_0019ee08;
    }
    insn->vectorExtensionPrefix[0] = local_54;
    iVar6 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,uVar18);
    if (iVar6 != 0) {
      return -1;
    }
    prVar24 = (reader_info *)insn->readerArg;
    uVar18 = insn->readerCursor + 1;
    insn->readerCursor = uVar18;
    puVar23 = insn->vectorExtensionPrefix + 2;
LAB_0019f12f:
    iVar6 = (*insn->reader)(prVar24,puVar23,uVar18);
    if (iVar6 != 0) {
      return -1;
    }
    uVar18 = insn->readerCursor + 1;
    insn->readerCursor = uVar18;
    if (insn->mode == MODE_64BIT) {
      insn->rexPrefix =
           (byte)~insn->vectorExtensionPrefix[1] >> 5 | insn->vectorExtensionPrefix[2] >> 4 & 8 |
           0x40;
    }
LAB_0019ee08:
    bVar21 = (byte)local_48;
  }
  DVar1 = insn->mode;
  bVar10 = (byte)local_40;
  if (DVar1 == MODE_64BIT) {
    if ((insn->rexPrefix & 8) != 0) {
      insn->registerSize = '\b';
      uVar11 = (~bVar10 & 1) * '\x04' + '\x04';
      uVar5 = '\x04';
      uVar22 = '\x04';
      goto LAB_0019ee5f;
    }
    uVar22 = (~bVar21 & 1) * '\x02' + '\x02';
    insn->registerSize = uVar22;
    insn->addressSize = (~bVar10 & 1) * '\x04' + '\x04';
    insn->displacementSize = uVar22;
    insn->immediateSize = uVar22;
    if (insn->rexPrefix == 0) {
      uVar22 = (~bVar21 & 1) * '\x04' + '\x04';
    }
LAB_0019ee72:
    insn->immSize = uVar22;
  }
  else {
    if (DVar1 == MODE_32BIT) {
      uVar22 = (~bVar21 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar22;
      bVar10 = ~bVar10;
LAB_0019ee55:
      uVar11 = (bVar10 & 1) * '\x02' + '\x02';
      uVar5 = uVar11;
LAB_0019ee5f:
      insn->addressSize = uVar11;
      insn->displacementSize = uVar5;
      insn->immediateSize = uVar22;
      goto LAB_0019ee72;
    }
    if (DVar1 == MODE_16BIT) {
      uVar22 = (bVar21 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar22;
      goto LAB_0019ee55;
    }
  }
  insn->opcodeType = ONEBYTE;
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
switchD_0019eea2_caseD_1:
    insn->twoByteEscape = '\x0f';
switchD_0019ef2b_caseD_1:
    insn->opcodeType = TWOBYTE;
    break;
  case TYPE_VEX_3B:
    bVar10 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar10 != 3) {
      if (bVar10 == 2) {
        insn->twoByteEscape = '\x0f';
        insn->threeByteEscape = '8';
        goto switchD_0019ef2b_caseD_2;
      }
      if (bVar10 != 1) {
        return -1;
      }
      goto switchD_0019eea2_caseD_1;
    }
    insn->twoByteEscape = '\x0f';
    insn->threeByteEscape = ':';
switchD_0019ef2b_caseD_3:
    insn->opcodeType = THREEBYTE_3A;
    break;
  case TYPE_EVEX:
    switch(insn->vectorExtensionPrefix[1] & 3) {
    case 0:
      return -1;
    case 1:
      goto switchD_0019ef2b_caseD_1;
    case 2:
switchD_0019ef2b_caseD_2:
      insn->opcodeType = THREEBYTE_38;
      break;
    case 3:
      goto switchD_0019ef2b_caseD_3;
    }
    break;
  case TYPE_XOP:
    bVar10 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar10 == 10) {
      insn->opcodeType = XOPA_MAP;
    }
    else if (bVar10 == 9) {
      insn->opcodeType = XOP9_MAP;
    }
    else {
      if (bVar10 != 8) {
        return -1;
      }
      insn->opcodeType = XOP8_MAP;
    }
    break;
  default:
    iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_53,uVar18);
    if (iVar6 != 0) {
      return -1;
    }
    uVar18 = insn->readerCursor + 1;
    insn->readerCursor = uVar18;
    insn->firstByte = local_53;
    if (local_53 == 0xf) {
      insn->twoByteEscape = '\x0f';
      iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_53,uVar18);
      if (iVar6 != 0) {
        return -1;
      }
      uVar18 = insn->readerCursor + 1;
      insn->readerCursor = uVar18;
      if (local_53 < 0x38) {
        if (local_53 == 0xe) {
          insn->opcodeType = T3DNOW_MAP;
          insn->consumedModRM = true;
        }
        else {
          if (local_53 != 0xf) goto LAB_0019f890;
          iVar6 = readModRM(insn);
          if (iVar6 != 0) {
            return -1;
          }
          iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_53,insn->readerCursor);
          if (iVar6 != 0) {
            return -1;
          }
          insn->readerCursor = insn->readerCursor + 1;
          insn->opcodeType = T3DNOW_MAP;
        }
      }
      else if (local_53 == 0x3a) {
        insn->threeByteEscape = ':';
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_53,uVar18);
        if (iVar6 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_3A;
      }
      else if (local_53 == 0x38) {
        insn->threeByteEscape = '8';
        iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&local_53,uVar18);
        if (iVar6 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_38;
      }
      else {
LAB_0019f890:
        insn->opcodeType = TWOBYTE;
      }
    }
    insn->opcode = local_53;
    goto LAB_0019f2da;
  }
  iVar6 = (*insn->reader)((reader_info *)insn->readerArg,&insn->opcode,uVar18);
  if (iVar6 != 0) {
    return -1;
  }
  insn->readerCursor = insn->readerCursor + 1;
LAB_0019f2da:
  VVar2 = insn->vectorExtensionType;
  bVar25 = insn->mode == MODE_64BIT;
  if (VVar2 == TYPE_NO_VEX_XOP) {
    if (((insn->mode == MODE_16BIT) || (insn->isPrefix66 != true)) ||
       (insn->prefix66 != insn->necessaryPrefixLocation)) {
      uVar18 = insn->necessaryPrefixLocation;
      if ((insn->isPrefix67 == true) && (insn->prefix67 == uVar18)) {
        uVar20 = bVar25 | 0x20;
      }
      else if ((insn->isPrefixf3 == true) && (insn->prefixf3 == uVar18)) {
        uVar20 = bVar25 | 2;
      }
      else {
        uVar20 = (ushort)bVar25;
        if ((insn->isPrefixf2 == true) && (insn->prefixf2 == uVar18)) {
          uVar20 = bVar25 | 4;
        }
      }
    }
    else {
      uVar20 = bVar25 | 0x10;
    }
  }
  else {
    uVar20 = 0x40;
    if (VVar2 == TYPE_EVEX) {
      uVar20 = 0x100;
    }
    uVar20 = bVar25 | uVar20;
    if (VVar2 == TYPE_EVEX) {
      switch(insn->vectorExtensionPrefix[2] & 3) {
      case 1:
        uVar20 = uVar20 | 0x10;
        break;
      case 2:
        uVar20 = uVar20 | 2;
        break;
      case 3:
        uVar20 = uVar20 | 4;
      }
      bVar10 = insn->vectorExtensionPrefix[3];
      if ((char)bVar10 < '\0') {
        uVar20 = uVar20 + 0x1000;
      }
      sVar14 = (bVar10 & 0x10) * 0x200;
      sVar4 = sVar14 + 0x800;
      if ((bVar10 & 7) == 0) {
        sVar4 = sVar14;
      }
      uVar20 = (bVar10 & 0x60) << 4 | sVar4 + uVar20;
    }
    else {
      if (VVar2 == TYPE_VEX_2B) {
        bVar10 = insn->vectorExtensionPrefix[1];
        uVar13 = (ushort)bVar10;
        uVar12 = (ushort)bVar10;
        switch(bVar10 & 3) {
        case 1:
          goto switchD_0019f3a7_caseD_1;
        case 2:
          goto switchD_0019f3a7_caseD_2;
        case 3:
          goto switchD_0019f3a7_caseD_3;
        }
      }
      else if (VVar2 == TYPE_XOP) {
        bVar10 = insn->vectorExtensionPrefix[2];
        uVar13 = (ushort)bVar10;
        uVar12 = (ushort)bVar10;
        switch(bVar10 & 3) {
        case 1:
          goto switchD_0019f3a7_caseD_1;
        case 2:
          goto switchD_0019f3a7_caseD_2;
        case 3:
          goto switchD_0019f3a7_caseD_3;
        }
      }
      else {
        if (VVar2 != TYPE_VEX_3B) {
          return -1;
        }
        bVar10 = insn->vectorExtensionPrefix[2];
        uVar13 = (ushort)bVar10;
        uVar12 = (ushort)bVar10;
        switch(bVar10 & 3) {
        case 1:
switchD_0019f3a7_caseD_1:
          uVar12 = uVar13;
          uVar20 = uVar20 | 0x10;
          break;
        case 2:
switchD_0019f3a7_caseD_2:
          uVar12 = uVar13;
          uVar20 = uVar20 | 2;
          break;
        case 3:
switchD_0019f3a7_caseD_3:
          uVar12 = uVar13;
          uVar20 = uVar20 | 4;
        }
      }
      uVar20 = uVar20 | (uVar12 & 4) << 5;
    }
  }
  attrMask = uVar20 | insn->rexPrefix & 8;
  iVar6 = getIDWithAttrMask(&local_52,insn,attrMask);
  if (iVar6 != 0) {
    return -1;
  }
  if (insn->mode == MODE_16BIT) {
    if ((insn->opcode == 0xe3) && (x86DisassemblerInstrSpecifiers[local_52].operands == 0x9c)) {
      attrMask = attrMask ^ 0x20;
      iVar6 = getIDWithAttrMask(&local_52,insn,attrMask);
      if (iVar6 != 0) {
        return -1;
      }
      if (insn->mode != MODE_16BIT) goto LAB_0019f537;
    }
    if ((attrMask & 0x10) == 0) goto LAB_0019f54b;
LAB_0019f5da:
    if (((insn->opcodeType == ONEBYTE) && (insn->opcode == 0x90)) && ((insn->rexPrefix & 1) != 0)) {
      insn->opcode = 0x91;
      iVar6 = getIDWithAttrMask(&local_34,insn,attrMask);
      if (iVar6 == 0) {
        local_52 = local_34;
      }
      insn->opcode = 0x90;
      insn->instructionID = local_52;
      insn->spec = x86DisassemblerInstrSpecifiers + local_52;
    }
    else {
      insn->instructionID = local_52;
      insn->spec = x86DisassemblerInstrSpecifiers + local_52;
    }
  }
  else {
LAB_0019f537:
    if (((attrMask & 0x10) != 0) || (insn->isPrefix66 == false)) goto LAB_0019f5da;
LAB_0019f54b:
    iVar6 = getIDWithAttrMask(&local_32,insn,attrMask | 0x10);
    if ((iVar6 == 0) &&
       ((x86_16_bit_eq_lookup[local_52] != 0 &&
        (uVar15 = x86_16_bit_eq_lookup[local_52] - 1, uVar9 = (ulong)uVar15, uVar15 < 0x381)))) {
      uVar19 = (ulong)local_32;
      do {
        if (x86_16_bit_eq_tbl[uVar9].first != local_52) break;
        if (x86_16_bit_eq_tbl[uVar9].second == local_32) {
          if (insn->isPrefix66 != (insn->mode == MODE_16BIT)) {
            insn->instructionID = local_32;
            local_52 = local_32;
            goto LAB_0019f57f;
          }
          break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x381);
    }
    insn->instructionID = local_52;
    uVar19 = (ulong)local_52;
LAB_0019f57f:
    insn->spec = x86DisassemblerInstrSpecifiers + uVar19;
  }
  iVar6 = -1;
  if (local_52 == 0) {
    return -1;
  }
  if (insn->isPrefixf0 != true) {
    if ((insn->isPrefixf2 == true) && (insn->twoByteEscape == '\x0f')) {
      insn->prefix0 = '\0';
    }
    goto LAB_0019f92d;
  }
  uVar15 = (uint)local_52;
  if (local_52 < 0x380) {
    if (uVar15 == 0x132 || local_52 < 0x132) {
      if (((local_52 - 0x21 < 0x35) &&
          ((0x1c01c0181c0e07U >> ((ulong)(local_52 - 0x21) & 0x3f) & 1) != 0)) ||
         ((local_52 - 0xac < 0x1d && ((0x181c0e07U >> (local_52 - 0xac & 0x1f) & 1) != 0))))
      goto LAB_0019f92d;
      uVar15 = uVar15 - 0x5f;
      if (0xd < uVar15) {
        return -1;
      }
      uVar16 = 0x3007;
    }
    else {
      if (((local_52 - 0x133 < 0x22) &&
          ((0x333333333U >> ((ulong)(local_52 - 0x133) & 0x3f) & 1) != 0)) ||
         ((local_52 - 0x23a < 9 && ((0x1abU >> (local_52 - 0x23a & 0x1f) & 1) != 0))))
      goto LAB_0019f92d;
      uVar15 = uVar15 - 0x28e;
      if (0xc < uVar15) {
        return -1;
      }
      uVar16 = 0x1551;
    }
  }
  else if (uVar15 == 0x9cf || local_52 < 0x9cf) {
    if (((local_52 - 0x70e < 0x3e) &&
        ((0x3c0e550000000055U >> ((ulong)(local_52 - 0x70e) & 0x3f) & 1) != 0)) ||
       ((local_52 - 0x380 < 0xd && ((0x1551U >> (local_52 - 0x380 & 0x1f) & 1) != 0))))
    goto LAB_0019f92d;
    uVar15 = uVar15 - 0x752;
    if (10 < uVar15) {
      return -1;
    }
    uVar16 = 0x607;
  }
  else {
    if (((local_52 - 0x1829 < 0x3d) &&
        ((0x181c0e0700148855U >> ((ulong)(local_52 - 0x1829) & 0x3f) & 1) != 0)) ||
       ((local_52 - 0x9d0 < 0x1d && ((0x181c0e07U >> (local_52 - 0x9d0 & 0x1f) & 1) != 0))))
    goto LAB_0019f92d;
    uVar15 = uVar15 - 0xad3;
    if (0x1c < uVar15) {
      return -1;
    }
    uVar16 = 0x181c0e07;
  }
  if ((uVar16 >> (uVar15 & 0x1f) & 1) == 0) {
    return -1;
  }
LAB_0019f92d:
  iVar7 = readOperands(insn);
  if ((iVar7 == 0) &&
     (uVar9 = insn->readerCursor - insn->startLocation, insn->length = uVar9, uVar9 < 0x10)) {
    if (insn->operandSize == '\0') {
      insn->operandSize = insn->registerSize;
    }
    insn->operands = x86OperandSets[insn->spec->operands];
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			checkPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}